

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O1

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithBoolSelType
          (DtFromPseudoRootDtConverter *this,PseudoDt *pseudoDt)

{
  unsigned_long_long *this_00;
  _Hash_node_base *p_Var1;
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> __fn;
  int iVar2;
  mapped_type *pmVar3;
  undefined8 in_RCX;
  __uniq_ptr_data<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>,_true,_true>
  in_RDX;
  void *__child_stack;
  pointer *__ptr;
  __node_base _Var4;
  DtFromPseudoRootDtConverter *this_01;
  void *in_R8;
  Up containedDt;
  _tPseudoDtSels selLocPseudoDtsPair;
  undefined1 local_c8 [8];
  _Head_base<0UL,_const_yactfr::MapItem_*,_false> local_c0;
  _Head_base<0UL,_const_yactfr::StructureType_*,_false> local_b8;
  undefined1 local_ac [4];
  undefined1 local_a8 [32];
  _tPseudoDtSels local_88;
  
  if (*(int *)((pseudoDt->_loc)._lineNumber + 8) != 2) {
    __assert_fail("_pseudoTraceType->majorVersion() == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                  ,0x3c6,
                  "DataType::Up yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoOptWithBoolSelType(const PseudoDt &)"
                 );
  }
  _pseudoDtSels<yactfr::internal::PseudoOptType>
            ((_tPseudoDtSels *)(local_a8 + 0x20),(DtFromPseudoRootDtConverter *)pseudoDt,
             (PseudoOptType *)
             in_RDX.
             super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>
             .super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl);
  _Var4._M_nxt = local_88.second._M_h._M_before_begin._M_nxt;
  while( true ) {
    iVar2 = (int)in_RCX;
    if (_Var4._M_nxt == (_Hash_node_base *)0x0) {
      this_00 = &(pseudoDt->_posInScope).super_type.m_storage;
      pmVar3 = std::__detail::
               _Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)local_a8);
      *pmVar3 = 0;
      _dtFromPseudoDt((DtFromPseudoRootDtConverter *)local_c8,pseudoDt);
      local_a8._0_8_ =
           in_RDX.
           super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>
           .super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
      std::
      _Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase((_Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this_00);
      local_ac = (undefined1  [4])0x1;
      __fn._M_head_impl =
           (((WithAttrsMixin *)
            ((long)in_RDX.
                   super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>
                   .super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl + 0x30))->
           _attrs)._M_t.
           super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>
           .super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl;
      if (__fn._M_head_impl == (MapItem *)0x0) {
        local_c0._M_head_impl = (MapItem *)0x0;
      }
      else {
        MapItem::clone((MapItem *)local_a8,(__fn *)__fn._M_head_impl,__child_stack,iVar2,in_R8);
        local_c0._M_head_impl = (MapItem *)local_a8._0_8_;
        local_a8._0_8_ = (PseudoErt *)0x0;
        std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
        ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>
                     *)local_a8);
      }
      std::
      make_unique<yactfr::OptionalWithBooleanSelectorType_const,int,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::DataLocation,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
                ((int *)&local_b8,
                 (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *
                 )local_ac,(DataLocation *)local_c8,
                 (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                 (local_a8 + 0x20));
      (this->_dt)._M_t.
      super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
      .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl =
           local_b8._M_head_impl;
      local_b8._M_head_impl = (StructureType *)0x0;
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  &local_c0);
      if (local_c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
      std::
      _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_88.second._M_h);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88.first._pathElems);
      return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
              )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
                )this;
    }
    p_Var1 = _Var4._M_nxt[1]._M_nxt;
    iVar2 = (*(code *)p_Var1->_M_nxt[2]._M_nxt)(p_Var1);
    if ((iVar2 != 0) || ((~*(uint *)&p_Var1[6]._M_nxt[1]._M_nxt & 0x126) != 0)) break;
    _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
  }
  local_a8._0_8_ = (long)local_a8 + 0x10;
  this_01 = (DtFromPseudoRootDtConverter *)local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)this_01,"Selector type of optional type isn\'t a boolean type.","");
  _throwInvalDataLoc(this_01,(string *)local_a8,(TextLocation *)(p_Var1 + 1),
                     (DataLocation *)(local_a8 + 0x20),
                     (TextLocation *)
                     ((long)in_RDX.
                            super___uniq_ptr_impl<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_yactfr::MapItem_*,_std::default_delete<const_yactfr::MapItem>_>
                            .super__Head_base<0UL,_const_yactfr::MapItem_*,_false>._M_head_impl + 8)
                    );
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoOptWithBoolSelType(const PseudoDt& pseudoDt)
{
    assert(_pseudoTraceType->majorVersion() == 2);

    auto& pseudoOptType = static_cast<const PseudoOptType&>(pseudoDt);
    auto selLocPseudoDtsPair = this->_pseudoDtSels(pseudoOptType);

    for (const auto pseudoSelDt : selLocPseudoDtsPair.second) {
        if (pseudoSelDt->kind() != PseudoDt::Kind::ScalarDtWrapper ||
                !static_cast<const PseudoScalarDtWrapper&>(*pseudoSelDt).dt().isFixedLengthBooleanType()) {
            this->_throwInvalDataLoc("Selector type of optional type isn't a boolean type.",
                                     pseudoSelDt->loc(), selLocPseudoDtsPair.first, pseudoDt.loc());
        }
    }

    auto containedDt = this->_whileVisitingPseudoDt(pseudoOptType, [this](auto& pseudoOptType) {
        return this->_dtFromPseudoDt(pseudoOptType.pseudoDt());
    });

    return OptionalWithBooleanSelectorType::create(1, std::move(containedDt),
                                                   std::move(selLocPseudoDtsPair.first),
                                                   tryCloneAttrs(pseudoOptType.attrs()));
}